

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::dispose
          (Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *this)

{
  Tuple<kj::String,_kj::Array<unsigned_long>_> *firstElement;
  size_t elementCount;
  size_t sizeCopy;
  Tuple<kj::String,_kj::Array<unsigned_long>_> *ptrCopy;
  Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *this_local;
  
  firstElement = this->ptr;
  elementCount = this->size_;
  if (firstElement != (Tuple<kj::String,_kj::Array<unsigned_long>_> *)0x0) {
    this->ptr = (Tuple<kj::String,_kj::Array<unsigned_long>_> *)0x0;
    this->size_ = 0;
    ArrayDisposer::dispose<kj::_::Tuple<kj::String,kj::Array<unsigned_long>>>
              (this->disposer,firstElement,elementCount,elementCount);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    size_t sizeCopy = size_;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      size_ = 0;
      disposer->dispose(ptrCopy, sizeCopy, sizeCopy);
    }
  }